

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

double __thiscall
fmt::v6::internal::grisu_shortest_handler::round(grisu_shortest_handler *this,double __x)

{
  ulong uVar1;
  ulong *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_R8;
  
  uVar1 = *in_RCX;
  while (((uVar1 < in_RSI && (in_RDX <= in_R8 - uVar1)) &&
         ((uVar1 + in_RDX < in_RSI || ((uVar1 + in_RDX) - in_RSI <= in_RSI - uVar1))))) {
    this->buf[(long)this->size + -1] = this->buf[(long)this->size + -1] + -1;
    uVar1 = *in_RCX + in_RDX;
    *in_RCX = uVar1;
  }
  return __x;
}

Assistant:

void round(uint64_t d, uint64_t divisor, uint64_t& remainder,
             uint64_t error) {
    while (
        remainder < d && error - remainder >= divisor &&
        (remainder + divisor < d || d - remainder >= remainder + divisor - d)) {
      --buf[size - 1];
      remainder += divisor;
    }
  }